

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts.h
# Opt level: O0

void __thiscall
libwebm::VpxPes2Ts::VpxPes2Ts(VpxPes2Ts *this,string *input_file_name,string *output_file_name)

{
  string *output_file_name_local;
  string *input_file_name_local;
  VpxPes2Ts *this_local;
  
  PacketReceiverInterface::PacketReceiverInterface(&this->super_PacketReceiverInterface);
  (this->super_PacketReceiverInterface)._vptr_PacketReceiverInterface =
       (_func_int **)&PTR__VpxPes2Ts_00140b18;
  std::__cxx11::string::string((string *)&this->input_file_name_,(string *)input_file_name);
  std::__cxx11::string::string((string *)&this->output_file_name_,(string *)output_file_name);
  std::unique_ptr<_IO_FILE,libwebm::FILEDeleter>::unique_ptr<libwebm::FILEDeleter,void>
            ((unique_ptr<_IO_FILE,libwebm::FILEDeleter> *)&this->output_file_);
  std::unique_ptr<libwebm::Webm2Pes,std::default_delete<libwebm::Webm2Pes>>::
  unique_ptr<std::default_delete<libwebm::Webm2Pes>,void>
            ((unique_ptr<libwebm::Webm2Pes,std::default_delete<libwebm::Webm2Pes>> *)
             &this->pes_converter_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->ts_buffer_);
  return;
}

Assistant:

VpxPes2Ts(const std::string& input_file_name,
            const std::string& output_file_name)
      : input_file_name_(input_file_name),
        output_file_name_(output_file_name) {}